

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

void testing::internal::ParseGoogleTestFlagsOnlyImpl<char>(int *argc,char **argv)

{
  int iVar1;
  long lVar2;
  bool bVar3;
  char **in_RDX;
  char **extraout_RDX;
  _Alloc_hider path;
  string *str;
  int iVar4;
  long lVar5;
  long in_FS_OFFSET;
  string arg_string;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  iVar4 = 1;
  str = (string *)argc;
  do {
    if (*argc <= iVar4) {
      if (g_help_flag != '\0') {
        PrintColorEncoded((char *)str);
      }
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
        return;
      }
      __stack_chk_fail();
    }
    lVar5 = (long)iVar4;
    StreamableToString<char*>(&arg_string,(internal *)(argv + lVar5),in_RDX);
    path = arg_string._M_dataplus;
    bVar3 = ParseGoogleTestFlag(arg_string._M_dataplus._M_p);
    if (bVar3) {
LAB_0015dac8:
      iVar1 = *argc;
      for (; iVar1 != lVar5; lVar5 = lVar5 + 1) {
        argv[lVar5] = argv[lVar5 + 1];
      }
      *argc = iVar1 + -1;
      iVar4 = iVar4 + -1;
    }
    else {
      bVar3 = ParseStringFlag<std::__cxx11::string>
                        (path._M_p,"flagfile",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &FLAGS_gtest_flagfile_abi_cxx11_);
      if (bVar3) {
        LoadFlagsFromFile((string *)path._M_p);
        goto LAB_0015dac8;
      }
      bVar3 = std::operator==(&arg_string,"--help");
      if (bVar3) {
LAB_0015db40:
        g_help_flag = '\x01';
      }
      else {
        bVar3 = std::operator==(&arg_string,"-h");
        if (bVar3) goto LAB_0015db40;
        bVar3 = std::operator==(&arg_string,"-?");
        if (bVar3) goto LAB_0015db40;
        bVar3 = std::operator==(&arg_string,"/?");
        if (bVar3) goto LAB_0015db40;
        bVar3 = HasGoogleTestFlagPrefix(arg_string._M_dataplus._M_p);
        if (bVar3) goto LAB_0015db40;
      }
    }
    str = &arg_string;
    std::__cxx11::string::~string((string *)&arg_string);
    iVar4 = iVar4 + 1;
    in_RDX = extraout_RDX;
  } while( true );
}

Assistant:

void ParseGoogleTestFlagsOnlyImpl(int* argc, CharType** argv) {
  for (int i = 1; i < *argc; i++) {
    const std::string arg_string = StreamableToString(argv[i]);
    const char* const arg = arg_string.c_str();

    using internal::ParseBoolFlag;
    using internal::ParseInt32Flag;
    using internal::ParseStringFlag;

    bool remove_flag = false;
    if (ParseGoogleTestFlag(arg)) {
      remove_flag = true;
#if GTEST_USE_OWN_FLAGFILE_FLAG_
    } else if (ParseStringFlag(arg, kFlagfileFlag, &GTEST_FLAG(flagfile))) {
      LoadFlagsFromFile(GTEST_FLAG(flagfile));
      remove_flag = true;
#endif  // GTEST_USE_OWN_FLAGFILE_FLAG_
    } else if (arg_string == "--help" || arg_string == "-h" ||
               arg_string == "-?" || arg_string == "/?" ||
               HasGoogleTestFlagPrefix(arg)) {
      // Both help flag and unrecognized Google Test flags (excluding
      // internal ones) trigger help display.
      g_help_flag = true;
    }

    if (remove_flag) {
      // Shift the remainder of the argv list left by one.  Note
      // that argv has (*argc + 1) elements, the last one always being
      // NULL.  The following loop moves the trailing NULL element as
      // well.
      for (int j = i; j != *argc; j++) {
        argv[j] = argv[j + 1];
      }

      // Decrements the argument count.
      (*argc)--;

      // We also need to decrement the iterator as we just removed
      // an element.
      i--;
    }
  }

  if (g_help_flag) {
    // We print the help here instead of in RUN_ALL_TESTS(), as the
    // latter may not be called at all if the user is using Google
    // Test with another testing framework.
    PrintColorEncoded(kColorEncodedHelpMessage);
  }
}